

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hashutil.cpp
# Opt level: O0

void __thiscall
HashUtil_Sha256DByteData256_Test::~HashUtil_Sha256DByteData256_Test
          (HashUtil_Sha256DByteData256_Test *this)

{
  HashUtil_Sha256DByteData256_Test *this_local;
  
  ~HashUtil_Sha256DByteData256_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(HashUtil, Sha256DByteData256) {
  ByteData256 target(
      "1234567890123456789012345678901234567890123456789012345678901234");
  ByteData256 byte_data = HashUtil::Sha256D(target);
  EXPECT_STREQ(
      byte_data.GetHex().c_str(),
      "62e5fa013750097309ebcb838db33d1a9fe2e3083231fd87ce735ce4c0ca1e4c");
}